

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O0

shared_ptr<const_helics::SmallBuffer> * __thiscall
helics::InputInfo::getData(InputInfo *this,uint32_t *inputIndex)

{
  bool bVar1;
  const_iterator cVar2;
  reference this_00;
  int *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int> *cd;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>_>_>
  *__range1;
  Time mxTime;
  int mxind;
  int ind;
  vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>_>_>
  *in_stack_ffffffffffffffa8;
  __normal_iterator<const_std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>_*,_std::vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>_>_>_>
  local_38;
  pointer *local_30;
  TimeRepresentation<count_time<9,_long>_> local_28;
  int local_20;
  int local_1c;
  int *local_18;
  const_reference local_8;
  
  local_1c = 0;
  local_20 = -1;
  local_28.internalTimeCode = -0x7fffffffffffffff;
  local_30 = &in_RDI[5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_18 = in_RSI;
  local_38._M_current =
       (pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int> *)
       std::
       vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>_>_>
       ::begin(in_stack_ffffffffffffffa8);
  cVar2 = std::
          vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>_>_>
          ::end(in_stack_ffffffffffffffa8);
  while (bVar1 = __gnu_cxx::
                 operator==<const_std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>_*,_std::vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>_>_>_>
                           ((__normal_iterator<const_std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>_*,_std::vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>_>_>_>
                             *)in_RDI,
                            (__normal_iterator<const_std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>_*,_std::vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>_>_>_>
                             *)in_stack_ffffffffffffffa8), ((bVar1 ^ 0xffU) & 1) != 0) {
    this_00 = __gnu_cxx::
              __normal_iterator<const_std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>_*,_std::vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>_>_>_>
              ::operator*(&local_38);
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator>(&this_00->first,&local_28);
    if (bVar1) {
      local_28.internalTimeCode = (this_00->first).internalTimeCode;
      local_20 = local_1c;
    }
    else {
      bVar1 = TimeRepresentation<count_time<9,_long>_>::operator==(&this_00->first,&local_28);
      if ((bVar1) &&
         (bVar1 = priorityCheck((int32_t)cVar2._M_current,(int32_t)((ulong)this_00 >> 0x20),in_RDI),
         bVar1)) {
        local_20 = local_1c;
      }
    }
    local_1c = local_1c + 1;
    __gnu_cxx::
    __normal_iterator<const_std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>_*,_std::vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>_>_>_>
    ::operator++(&local_38);
  }
  if (local_20 < 0) {
    if (local_18 != (int *)0x0) {
      *local_18 = 0;
    }
    local_8 = (const_reference)NullData;
  }
  else {
    if (local_18 != (int *)0x0) {
      *local_18 = local_20;
    }
    local_8 = std::
              vector<std::shared_ptr<const_helics::SmallBuffer>,_std::allocator<std::shared_ptr<const_helics::SmallBuffer>_>_>
              ::operator[]((vector<std::shared_ptr<const_helics::SmallBuffer>,_std::allocator<std::shared_ptr<const_helics::SmallBuffer>_>_>
                            *)&in_RDI[6].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish,(long)local_20);
  }
  return local_8;
}

Assistant:

const std::shared_ptr<const SmallBuffer>& InputInfo::getData(uint32_t* inputIndex) const
{
    int ind{0};
    int mxind{-1};
    Time mxTime{Time::minVal()};
    for (const auto& cd : current_data_time) {
        if (cd.first > mxTime) {
            mxTime = cd.first;
            mxind = ind;
        } else if (cd.first == mxTime) {
            if (priorityCheck(ind, mxind, priority_sources)) {
                mxind = ind;
            }
        }
        ++ind;
    }
    if (mxind >= 0) {
        if (inputIndex != nullptr) {
            *inputIndex = mxind;
        }
        return current_data[mxind];
    }
    if (inputIndex != nullptr) {
        *inputIndex = 0;
    }
    return NullData;
}